

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O1

int SUNMatZero_Dense(SUNMatrix A)

{
  long lVar1;
  
  lVar1 = (long)*(int *)((long)A->content + 0x10);
  if (0 < lVar1) {
    memset(*(void **)((long)A->content + 8),0,lVar1 << 3);
  }
  return 0;
}

Assistant:

int SUNMatZero_Dense(SUNMatrix A)
{
  sunindextype i;
  realtype *Adata;

  /* Perform operation */
  Adata = SM_DATA_D(A);
  for (i=0; i<SM_LDATA_D(A); i++)
    Adata[i] = ZERO;
  return SUNMAT_SUCCESS;
}